

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O1

void RangeEnc_ShiftLow(CPpmd7z_RangeEnc *p)

{
  UInt64 *pUVar1;
  Byte BVar2;
  
  if (p->Low >> 0x18 != 0xff) {
    BVar2 = p->Cache;
    do {
      (*p->Stream->Write)(p->Stream,BVar2 + *(char *)((long)&p->Low + 4));
      pUVar1 = &p->CacheSize;
      *pUVar1 = *pUVar1 - 1;
      BVar2 = 0xff;
    } while (*pUVar1 != 0);
    p->Cache = *(Byte *)((long)&p->Low + 3);
  }
  p->CacheSize = p->CacheSize + 1;
  p->Low = (ulong)(uint)((int)p->Low << 8);
  return;
}

Assistant:

static void RangeEnc_ShiftLow(CPpmd7z_RangeEnc *p)
{
  if ((UInt32)p->Low < (UInt32)0xFF000000 || (unsigned)(p->Low >> 32) != 0)
  {
    Byte temp = p->Cache;
    do
    {
      p->Stream->Write(p->Stream, (Byte)(temp + (Byte)(p->Low >> 32)));
      temp = 0xFF;
    }
    while(--p->CacheSize != 0);
    p->Cache = (Byte)((UInt32)p->Low >> 24);
  }
  p->CacheSize++;
  p->Low = ((UInt32)p->Low << 8) & 0xFFFFFFFF;
}